

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

CodeGenRecyclableData * __thiscall
NativeCodeGenerator::GatherCodeGenData
          (NativeCodeGenerator *this,FunctionBody *topFunctionBody,FunctionBody *functionBody,
          EntryPointInfo *entryPoint,CodeGenWorkItem *workItem,void *function)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  Type TVar9;
  ThreadContextId pvVar10;
  PolymorphicInlineCacheInfoIDL *selfInfo;
  PolymorphicInlineCacheInfoIDL *inlineeInfo;
  code *pcVar11;
  ObjTypeSpecFldInfo **this_00;
  bool bVar12;
  CodeGenWorkItemType CVar13;
  ExecutionMode jitMode;
  uint uVar14;
  LocalFunctionId LVar15;
  int iVar16;
  int iVar17;
  ThreadContextId pvVar18;
  undefined4 *puVar19;
  Recycler *pRVar20;
  FunctionInfo *functionInfo;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  JitArenaAllocator *alloc;
  SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16 *pcVar22;
  NativeEntryPointData *pNVar23;
  PropertyId *ptr;
  FieldAccessStats *pFVar24;
  FieldAccessStats **ppFVar25;
  ScriptContext *this_02;
  undefined4 extraout_var_01;
  char16 *pcVar26;
  Recycler *this_03;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *array;
  Type_conflict node;
  FunctionBody *functionBody_00;
  EntryPointPolymorphicInlineCacheInfo *runtimeInfo;
  PolymorphicInlineCacheIDL **ppPVar27;
  CodeGenRecyclableData *this_04;
  Iterator IVar28;
  undefined4 uVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  JavascriptFunction *local_370;
  TrackAllocData local_278;
  CodeGenWorkItemIDL *local_250;
  CodeGenWorkItemIDL *jitData;
  ObjTypeSpecFldInfo **info;
  Iterator __iter;
  uint propertyInfoId;
  TrackAllocData local_218;
  uint local_1ec;
  uint objTypeSpecFldInfoCount;
  Type stats;
  FieldAccessStats *fieldAccessStats;
  char16 debugStringBuffer2 [42];
  wchar local_178 [4];
  char16 debugStringBuffer [42];
  TrackAllocData local_108;
  SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *local_e0;
  ObjTypeSpecFldInfoList *objTypeSpecFldInfoList;
  ArenaAllocator *gatherCodeGenDataAllocator;
  TempArenaAllocatorObject *tempgatherCodeGenDataAllocator;
  InliningDecider inliningDecider;
  FunctionCodeGenJitTimeData *jitTimeData;
  Recycler *recycler;
  AutoProfile local_60;
  AutoProfile autoProfile;
  void *function_local;
  CodeGenWorkItem *workItem_local;
  EntryPointInfo *entryPoint_local;
  FunctionBody *functionBody_local;
  FunctionBody *topFunctionBody_local;
  NativeCodeGenerator *this_local;
  
  pvVar10 = this->mainThreadId;
  autoProfile.codeGenProfiler = (ScriptContextProfiler *)function;
  pvVar18 = GetCurrentThreadContextId();
  if (pvVar10 != pvVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar19 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                        ,0xc2c,"(mainThreadId == GetCurrentThreadContextId())",
                        "Cannot use this member of native code generator from thread other than the creating context\'s current thread"
                       );
    if (!bVar12) {
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar19 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar19 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                        ,0xc2d,"(functionBody)","functionBody");
    if (!bVar12) {
      pcVar11 = (code *)invalidInstructionException();
      (*pcVar11)();
    }
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar19 = 0;
  }
  GatherCodeGenData(Js::FunctionBody*,Js::FunctionBody*,Js::EntryPointInfo*,CodeGenWorkItem*,void*)
  ::AutoProfile::AutoProfile(Js::ScriptContextProfiler__(&local_60,this->foregroundCodeGenProfiler);
  UpdateJITState(this);
  pRVar20 = Js::ScriptContext::GetRecycler(this->scriptContext);
  functionInfo = Js::FunctionProxy::GetFunctionInfo((FunctionProxy *)functionBody);
  inliningDecider._64_8_ = Js::FunctionCodeGenJitTimeData::New(pRVar20,functionInfo,entryPoint,true)
  ;
  CVar13 = CodeGenWorkItem::Type(workItem);
  bVar12 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)functionBody);
  jitMode = CodeGenWorkItem::GetJitMode(workItem);
  InliningDecider::InliningDecider
            ((InliningDecider *)&tempgatherCodeGenDataAllocator,functionBody,
             CVar13 == JsLoopBodyWorkItemType,bVar12,jitMode);
  gatherCodeGenDataAllocator =
       (ArenaAllocator *)
       Js::ScriptContext::GetTemporaryAllocator(this->scriptContext,L"GatherCodeGenData");
  this_01 = &Js::TempArenaAllocatorWrapper<false>::GetAllocator
                       ((TempArenaAllocatorWrapper<false> *)gatherCodeGenDataAllocator)->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  objTypeSpecFldInfoList = (ObjTypeSpecFldInfoList *)this_01;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_108,
             (type_info *)&SListCounted<ObjTypeSpecFldInfo*,Memory::ArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
             ,0xc4d);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this_01,&local_108);
  pSVar21 = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,alloc,0x4e98c0);
  SListCounted<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator>::SListCounted
            ((SListCounted<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator> *)pSVar21,
             (ArenaAllocator *)objTypeSpecFldInfoList);
  local_e0 = pSVar21;
  uVar14 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar15 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar14,LVar15);
  if (bVar12) {
LAB_0080236c:
    iVar17 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                       ();
    pcVar26 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_178);
    iVar16 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                       ();
    pcVar22 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)functionBody,(wchar (*) [42])&fieldAccessStats);
    Output::Print(L"ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n",
                  CONCAT44(extraout_var,iVar17),pcVar26,CONCAT44(extraout_var_00,iVar16),pcVar22);
  }
  else {
    uVar14 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar15 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar14,LVar15);
    if (bVar12) goto LAB_0080236c;
  }
  uVar30 = inliningDecider._64_8_;
  pSVar21 = local_e0;
  if (autoProfile.codeGenProfiler == (ScriptContextProfiler *)0x0) {
    local_370 = (JavascriptFunction *)0x0;
  }
  else {
    local_370 = Js::VarTo<Js::JavascriptFunction>(autoProfile.codeGenProfiler);
  }
  uVar32 = 0;
  GatherCodeGenData<false>
            (this,pRVar20,topFunctionBody,functionBody,entryPoint,
             (InliningDecider *)&tempgatherCodeGenDataAllocator,(ObjTypeSpecFldInfoList *)pSVar21,
             (FunctionCodeGenJitTimeData *)uVar30,(FunctionCodeGenRuntimeData *)0x0,local_370,false,
             0);
  uVar29 = (undefined4)((ulong)pSVar21 >> 0x20);
  uVar31 = SUB84(uVar30,4);
  uVar33 = (undefined4)((ulong)local_370 >> 0x20);
  pNVar23 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  ptr = NativeEntryPointData::GetSharedPropertyGuards
                  (pNVar23,pRVar20,(uint *)(inliningDecider._64_8_ + 0xa8));
  Memory::WriteBarrierPtr<int>::operator=
            ((WriteBarrierPtr<int> *)(inliningDecider._64_8_ + 0xa0),ptr);
  pFVar24 = Js::EntryPointInfo::EnsureFieldAccessStats(entryPoint,pRVar20);
  stats.ptr = pFVar24;
  ppFVar25 = Memory::WriteBarrierPtr::operator_cast_to_FieldAccessStats__
                       ((WriteBarrierPtr *)(inliningDecider._64_8_ + 0x90));
  Js::FieldAccessStats::Add(pFVar24,*ppFVar25);
  this_02 = Js::EntryPointInfo::GetScriptContext(entryPoint);
  Js::ScriptContext::RecordFieldAccessStats(this_02,topFunctionBody,stats.ptr);
  uVar14 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  LVar15 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
  bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar14,LVar15);
  if (!bVar12) {
    uVar14 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    LVar15 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunctionBody);
    bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar14,LVar15);
    if (!bVar12) goto LAB_008029ae;
  }
  Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18,
             (WriteBarrierPtr<Js::FieldAccessStats> *)(inliningDecider._64_8_ + 0x90));
  iVar17 = (*(topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
             super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])()
  ;
  pcVar26 = Js::FunctionProxy::GetDebugNumberSet
                      ((FunctionProxy *)topFunctionBody,(wchar (*) [42])local_178);
  Output::Print(L"ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n",
                CONCAT44(extraout_var_01,iVar17),pcVar26);
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar1 = pFVar24->totalInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)uVar1,
                (ulong)pFVar24->noInfoInlineCacheCount);
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar1 = pFVar24->monoInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar2 = pFVar24->emptyMonoInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  Output::Print(L"    mono: total %u, empty %u, cloned %u\n",(ulong)uVar1,(ulong)uVar2,
                (ulong)pFVar24->clonedMonoInlineCacheCount);
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar1 = pFVar24->polyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar2 = pFVar24->highUtilPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar3 = pFVar24->lowUtilPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar4 = pFVar24->nullPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  uVar5 = pFVar24->emptyPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  TVar6 = pFVar24->ignoredPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  TVar7 = pFVar24->disabledPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  TVar8 = pFVar24->equivPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  TVar9 = pFVar24->nonEquivPolyInlineCacheCount;
  pFVar24 = Memory::WriteBarrierPtr<Js::FieldAccessStats>::operator->
                      ((WriteBarrierPtr<Js::FieldAccessStats> *)&stack0xfffffffffffffe18);
  Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,
                CONCAT44(uVar29,TVar6),CONCAT44(uVar31,TVar7),CONCAT44(uVar32,TVar8),
                CONCAT44(uVar33,TVar9),pFVar24->clonedPolyInlineCacheCount);
LAB_008029ae:
  local_1ec = RealCount::Count(&local_e0->super_RealCount);
  uVar30 = inliningDecider._64_8_;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_218,(type_info *)&Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo,0,
             (ulong)local_1ec,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
             ,0xc72);
  this_03 = Memory::Recycler::TrackAllocInfo(pRVar20,&local_218);
  array = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>,false>
                    ((Memory *)this_03,(Recycler *)Memory::Recycler::Alloc,0,(ulong)local_1ec);
  Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfoArray
            ((FunctionCodeGenJitTimeData *)uVar30,array,local_1ec);
  __iter.current._4_4_ = local_1ec - 1;
  IVar28 = SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(local_e0)
  ;
  while( true ) {
    __iter.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                  IVar28.current;
    info = (ObjTypeSpecFldInfo **)IVar28.list;
    if (__iter.list == (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar12) {
        pcVar11 = (code *)invalidInstructionException();
        (*pcVar11)();
      }
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      IVar28.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      IVar28.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)info;
      *puVar19 = 0;
    }
    __iter.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                  IVar28.current;
    info = (ObjTypeSpecFldInfo **)IVar28.list;
    this_00 = info;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     ((SListNodeBase<Memory::ArenaAllocator> *)__iter.list);
    bVar12 = SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                       ((SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                        this_00,node);
    if (bVar12) break;
    __iter.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    jitData = (CodeGenWorkItemIDL *)
              SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&info);
    bVar12 = ObjTypeSpecFldInfo::GetKeepFieldValue(*(ObjTypeSpecFldInfo **)jitData);
    if ((!bVar12) &&
       ((bVar12 = ObjTypeSpecFldInfo::IsPoly(*(ObjTypeSpecFldInfo **)jitData), !bVar12 ||
        (bVar12 = ObjTypeSpecFldInfo::DoesntHaveEquivalence(*(ObjTypeSpecFldInfo **)jitData),
        !bVar12)))) {
      ObjTypeSpecFldInfo::SetFieldValue(*(ObjTypeSpecFldInfo **)jitData,(Var)0x0);
    }
    uVar14 = __iter.current._4_4_;
    __iter.current._4_4_ = __iter.current._4_4_ - 1;
    Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfo
              ((FunctionCodeGenJitTimeData *)inliningDecider._64_8_,uVar14,
               *(ObjTypeSpecFldInfo **)jitData);
    IVar28.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    IVar28.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)info;
  }
  __iter.list = (SListBase<ObjTypeSpecFldInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  Js::ScriptContext::ReleaseTemporaryAllocator
            (this->scriptContext,(TempArenaAllocatorObject *)gatherCodeGenDataAllocator);
  local_250 = CodeGenWorkItem::GetJITData(workItem);
  pNVar23 = Js::EntryPointInfo::GetNativeEntryPointData(entryPoint);
  functionBody_00 = CodeGenWorkItem::GetFunctionBody(workItem);
  runtimeInfo = NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
                          (pNVar23,pRVar20,functionBody_00);
  JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
            (pRVar20,runtimeInfo,local_250);
  uVar30 = inliningDecider._64_8_;
  selfInfo = local_250->selfInfo;
  inlineeInfo = local_250->inlineeInfo;
  ppPVar27 = Memory::WriteBarrierPtr::operator_cast_to_PolymorphicInlineCacheIDL__
                       ((WriteBarrierPtr *)&selfInfo->polymorphicInlineCaches);
  Js::FunctionCodeGenJitTimeData::SetPolymorphicInlineInfo
            ((FunctionCodeGenJitTimeData *)uVar30,inlineeInfo,selfInfo,*ppPVar27);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_278,(type_info *)&Js::CodeGenRecyclableData::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
             ,0xc8b);
  pRVar20 = Memory::Recycler::TrackAllocInfo(pRVar20,&local_278);
  this_04 = (CodeGenRecyclableData *)new<Memory::Recycler>(0x18,pRVar20,0x43c4b0);
  Js::CodeGenRecyclableData::CodeGenRecyclableData
            (this_04,(FunctionCodeGenJitTimeData *)inliningDecider._64_8_);
  InliningDecider::~InliningDecider((InliningDecider *)&tempgatherCodeGenDataAllocator);
  GatherCodeGenData::AutoProfile::~AutoProfile(&local_60);
  return this_04;
}

Assistant:

Js::CodeGenRecyclableData *
NativeCodeGenerator::GatherCodeGenData(Js::FunctionBody *const topFunctionBody, Js::FunctionBody *const functionBody, Js::EntryPointInfo *const entryPoint, CodeGenWorkItem* workItem, void* function)
{
    ASSERT_THREAD();
    Assert(functionBody);

#ifdef PROFILE_EXEC
    class AutoProfile
    {
    private:
        Js::ScriptContextProfiler *const codeGenProfiler;

    public:
        AutoProfile(Js::ScriptContextProfiler *const codeGenProfiler) : codeGenProfiler(codeGenProfiler)
        {
            ProfileBegin(codeGenProfiler, Js::DelayPhase);
            ProfileBegin(codeGenProfiler, Js::GatherCodeGenDataPhase);
        }

        ~AutoProfile()
        {
            ProfileEnd(codeGenProfiler, Js::GatherCodeGenDataPhase);
            ProfileEnd(codeGenProfiler, Js::DelayPhase);
        }
    } autoProfile(foregroundCodeGenProfiler);
#endif

    UpdateJITState();

    const auto recycler = scriptContext->GetRecycler();
    {
        const auto jitTimeData = Js::FunctionCodeGenJitTimeData::New(recycler, functionBody->GetFunctionInfo(), entryPoint);
        InliningDecider inliningDecider(functionBody, workItem->Type() == JsLoopBodyWorkItemType, functionBody->IsInDebugMode(), workItem->GetJitMode());

        BEGIN_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext, _u("GatherCodeGenData"));

        ObjTypeSpecFldInfoList* objTypeSpecFldInfoList = JitAnew(gatherCodeGenDataAllocator, ObjTypeSpecFldInfoList, gatherCodeGenDataAllocator);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            Output::Print(_u("ObjTypeSpec: top function %s (%s), function %s (%s): GatherCodeGenData(): \n"),
                topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer2));
        }
#endif
        GatherCodeGenData<false>(recycler, topFunctionBody, functionBody, entryPoint, inliningDecider, objTypeSpecFldInfoList, jitTimeData, nullptr, function ? Js::VarTo<Js::JavascriptFunction>(function) : nullptr, 0);

        jitTimeData->sharedPropertyGuards = entryPoint->GetNativeEntryPointData()->GetSharedPropertyGuards(recycler, jitTimeData->sharedPropertyGuardCount);

#ifdef FIELD_ACCESS_STATS
        Js::FieldAccessStats* fieldAccessStats = entryPoint->EnsureFieldAccessStats(recycler);
        fieldAccessStats->Add(jitTimeData->inlineCacheStats);
        entryPoint->GetScriptContext()->RecordFieldAccessStats(topFunctionBody, fieldAccessStats);
#endif

#ifdef FIELD_ACCESS_STATS
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            auto stats = jitTimeData->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: gathered code gen data for function %s (%s): inline cache stats:\n"), topFunctionBody->GetDisplayName(), topFunctionBody->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
#endif

        uint objTypeSpecFldInfoCount = objTypeSpecFldInfoList->Count();
        jitTimeData->SetGlobalObjTypeSpecFldInfoArray(RecyclerNewArray(recycler, Field(ObjTypeSpecFldInfo*), objTypeSpecFldInfoCount), objTypeSpecFldInfoCount);
        uint propertyInfoId = objTypeSpecFldInfoCount - 1;
        FOREACH_SLISTCOUNTED_ENTRY(ObjTypeSpecFldInfo*, info, objTypeSpecFldInfoList)
        {
            // Clear field values we don't need so we don't unnecessarily pin them while JIT-ing.
            if (!info->GetKeepFieldValue() && !(info->IsPoly() && info->DoesntHaveEquivalence()))
            {
                info->SetFieldValue(nullptr);
            }
            jitTimeData->SetGlobalObjTypeSpecFldInfo(propertyInfoId--, info);
        }
        NEXT_SLISTCOUNTED_ENTRY;

        END_TEMP_ALLOCATOR(gatherCodeGenDataAllocator, scriptContext);


        auto jitData = workItem->GetJITData();

        JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
            recycler,
            entryPoint->GetNativeEntryPointData()->EnsurePolymorphicInlineCacheInfo(recycler, workItem->GetFunctionBody()),
            jitData);

        jitTimeData->SetPolymorphicInlineInfo(jitData->inlineeInfo, jitData->selfInfo, jitData->selfInfo->polymorphicInlineCaches);

        return RecyclerNew(recycler, Js::CodeGenRecyclableData, jitTimeData);
    }
}